

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyRender.cpp
# Opt level: O3

void __thiscall TRM::TinyRender::triangle(TinyRender *this,Vec3f *pts,TGAColor *colors)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  TinyRender *pTVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  bool bVar12;
  float *pfVar13;
  int iVar14;
  int i;
  long lVar15;
  float fVar16;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar17;
  float fVar18;
  TGAColor c;
  TGAColor local_c0;
  float local_b8;
  float local_b4;
  TinyRender *local_b0;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float fStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  float local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  TGAImage::get_width(this->mImage);
  local_b0 = this;
  iVar9 = TGAImage::get_width(this->mImage);
  iVar10 = TGAImage::get_height(this->mImage);
  local_98 = (float)(iVar9 + -1);
  local_78 = ZEXT416((uint)(float)(iVar10 + -1));
  lVar15 = 0;
  local_9c = 0.0;
  local_a0 = 0.0;
  uStack_90 = extraout_XMM0_Dc;
  uStack_8c = extraout_XMM0_Dd;
  iVar9 = TGAImage::get_width(local_b0->mImage);
  iVar10 = TGAImage::get_height(local_b0->mImage);
  pTVar7 = local_b0;
  do {
    bVar12 = false;
    fVar18 = local_98;
    bVar8 = true;
    do {
      bVar11 = bVar8;
      if (bVar12) {
        fVar16 = pts[lVar15].field_1.y;
        fVar17 = fVar16;
        if ((float)local_78._0_4_ <= fVar16) {
          fVar17 = (float)local_78._0_4_;
        }
        if (fVar17 <= 0.0) {
          fVar17 = 0.0;
        }
        local_78._4_4_ = 0;
        local_78._8_4_ = 0;
        local_78._12_4_ = 0;
        pfVar13 = &local_a0;
        local_78._0_4_ = fVar17;
        local_98 = fVar18;
        iVar14 = iVar10;
      }
      else {
        fVar16 = pts[lVar15].field_0.x;
        local_98 = fVar16;
        if (fVar18 <= fVar16) {
          local_98 = fVar18;
        }
        if (local_98 <= 0.0) {
          local_98 = 0.0;
        }
        uStack_90 = 0;
        uStack_8c = 0;
        pfVar13 = &local_9c;
        iVar14 = iVar9;
      }
      if (fVar16 <= *pfVar13) {
        fVar16 = *pfVar13;
      }
      if ((float)(iVar14 + -1) <= fVar16) {
        fVar16 = (float)(iVar14 + -1);
      }
      *pfVar13 = fVar16;
      bVar12 = true;
      fVar18 = local_98;
      bVar8 = false;
    } while (bVar11);
    lVar15 = lVar15 + 1;
  } while (lVar15 != 3);
  local_a4 = local_9c;
  if (local_98 <= local_9c) {
    local_b8 = local_a0;
    fVar18 = local_a0;
    do {
      local_88 = (float)local_78._0_4_;
      uStack_84 = local_78._4_4_;
      uStack_80 = local_78._8_4_;
      uStack_7c = local_78._12_4_;
      if ((float)local_78._0_4_ <= fVar18) {
        do {
          uVar1 = pts->field_0;
          uVar4 = pts->field_1;
          uVar2 = pts[1].field_0;
          uVar5 = pts[1].field_1;
          uVar3 = pts[2].field_0;
          uVar6 = pts[2].field_1;
          fVar16 = ((float)uVar5 - (float)uVar4) * ((float)uVar3 - (float)uVar1) -
                   ((float)uVar6 - (float)uVar4) * ((float)uVar2 - (float)uVar1);
          local_58 = -1.0;
          local_68 = 1.0;
          fStack_4c = 0.0;
          local_48 = 1.0;
          if (0.01 < ABS(fVar16)) {
            local_68 = ((float)uVar1 - local_98) * ((float)uVar6 - (float)uVar4) -
                       ((float)uVar3 - (float)uVar1) * ((float)uVar4 - local_88);
            fStack_4c = ((float)uVar4 - local_88) * ((float)uVar2 - (float)uVar1) -
                        ((float)uVar1 - local_98) * ((float)uVar5 - (float)uVar4);
            local_58 = 1.0 - (fStack_4c + local_68) / fVar16;
            local_68 = local_68 / fVar16;
            local_48 = fStack_4c / fVar16;
          }
          if (((0.0 <= local_58) && (0.0 <= local_68)) && (0.0 <= local_48)) {
            local_b4 = pts[2].field_2.z * local_48 +
                       (pts->field_2).z * local_58 + pts[1].field_2.z * local_68;
            pfVar13 = pTVar7->mZBuffer;
            uStack_50 = 0;
            fStack_94 = local_88;
            fStack_64 = local_68;
            fStack_60 = local_68;
            fStack_5c = local_68;
            fStack_54 = local_68;
            fStack_44 = fStack_4c;
            fStack_40 = fStack_4c;
            fStack_3c = fStack_4c;
            iVar9 = TGAImage::get_width(pTVar7->mImage);
            fVar18 = local_b8;
            if (local_b4 < pfVar13[(int)((float)iVar9 * local_88 + local_98)] ||
                local_b4 == pfVar13[(int)((float)iVar9 * local_88 + local_98)]) {
              pfVar13 = pTVar7->mZBuffer;
              iVar9 = TGAImage::get_width(pTVar7->mImage);
              pfVar13[(int)((float)iVar9 * local_88 + local_98)] = local_b4;
              local_c0.bytespp = '\x01';
              local_c0.bgra[1] =
                   (uchar)(int)((float)colors[2].bgra[1] * local_48 +
                               (float)colors->bgra[1] * local_58 +
                               (float)colors[1].bgra[1] * local_68);
              local_c0.bgra[0] =
                   (uchar)(int)((float)colors[2].bgra[0] * local_48 +
                               (float)colors->bgra[0] * local_58 +
                               (float)colors[1].bgra[0] * local_68);
              local_c0.bgra[2] =
                   (char)(int)((float)colors[2].bgra[2] * local_48 +
                              (float)colors->bgra[2] * local_58 +
                              (float)colors[1].bgra[2] * local_68);
              local_c0.bgra[3] = '\0';
              TGAImage::set(pTVar7->mImage,(int)local_98,(int)local_88,&local_c0);
              fVar18 = local_b8;
            }
          }
          local_88 = local_88 + 1.0;
        } while (local_88 <= fVar18);
      }
      fVar16 = local_98 + 1.0;
      local_98 = local_98 + 1.0;
    } while (fVar16 <= local_a4);
  }
  return;
}

Assistant:

void TinyRender::triangle(Vec3f* pts, TGAColor* colors) {
  int width = mImage->get_width();

  Vec2i ptis[3];
  for (size_t i = 0; i < 3; i++) {
    ptis[i][0] = int(pts[i][0] + .5f);
    ptis[i][1] = int(pts[i][1] + .5f);
  }

  Vec2f bboxmin(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  Vec2f bboxmax(0, 0);
  Vec2f clamp(this->mImage->get_width() - 1, this->mImage->get_height() - 1);
  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = std::max(0.f, std::min(bboxmin[j], pts[i][j]));
      bboxmax[j] = std::min(clamp[j], std::max(bboxmax[j], pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      if (mZBuffer[int(p.x + p.y * mImage->get_width())] < pz) continue;

      mZBuffer[int(p.x + p.y * mImage->get_width())] = pz;

      TGAColor c;
      /*
          barycentric result can also interpolation Color
      */
      c.bgra[0] = bc_screen[0] * colors[0].bgra[0] +
                  bc_screen[1] * colors[1].bgra[0] +
                  bc_screen[2] * colors[2].bgra[0];
      c.bgra[1] = bc_screen[0] * colors[0].bgra[1] +
                  bc_screen[1] * colors[1].bgra[1] +
                  bc_screen[2] * colors[2].bgra[1];
      c.bgra[2] = bc_screen[0] * colors[0].bgra[2] +
                  bc_screen[1] * colors[1].bgra[2] +
                  bc_screen[2] * colors[2].bgra[2];

      mImage->set(p[0], p[1], c);
    }
  }
}